

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

ShapeRange * __thiscall
CoreML::ShapeRange::intersect(ShapeRange *__return_storage_ptr__,ShapeRange *this,ShapeRange *other)

{
  RangeValue *this_00;
  bool bVar1;
  ostream *poVar2;
  runtime_error *this_01;
  ShapeRange *val;
  RangeValue *val_00;
  string local_1d0 [32];
  stringstream ss;
  ostream local_1a0 [376];
  
  ShapeRange(__return_storage_ptr__);
  ss = (stringstream)(other->_minimum)._isUnbound;
  bVar1 = RangeValue::operator<=(&this->_minimum,(RangeValue *)&ss);
  val = this;
  if (bVar1) {
    ss = (stringstream)(other->_minimum)._isUnbound;
    val = (ShapeRange *)&ss;
  }
  setLower(__return_storage_ptr__,&val->_minimum);
  this_00 = &this->_maximum;
  ss = (stringstream)(other->_maximum)._isUnbound;
  bVar1 = RangeValue::operator>=(this_00,(RangeValue *)&ss);
  val_00 = this_00;
  if (bVar1) {
    ss = (stringstream)(other->_maximum)._isUnbound;
    val_00 = (RangeValue *)&ss;
  }
  setUpper(__return_storage_ptr__,val_00);
  bVar1 = RangeValue::operator>(&this->_minimum,this_00);
  if ((!bVar1) && ((this->_minimum)._isUnbound != true)) {
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_1a0,"Invalid intersection between ");
  ::operator<<(poVar2,this);
  poVar2 = std::operator<<(poVar2," and ");
  ::operator<<(poVar2,other);
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_01,local_1d0);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ShapeRange ShapeRange::intersect(const ShapeRange& other) const {

    // These routines will throw if it's invalid (i.e. max < min)
    ShapeRange out;
    if (_minimum <= other.minimum())
        out.setLower(other.minimum());
    else {
        out.setLower(_minimum);
    }

    if (_maximum >= other.maximum())
        out.setUpper(other.maximum());
    else {
        out.setUpper(_maximum);
    }

    if (_minimum > _maximum || _minimum.isUnbound()) {
        std::stringstream ss;
        ss << "Invalid intersection between " << *this << " and " << other;
        throw std::runtime_error(ss.str());
    }

    return out;

}